

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.h
# Opt level: O0

IMAGE_DEBUG_DIRECTORY * __thiscall DebugDirWrapper::getDebugDir(DebugDirWrapper *this,size_t index)

{
  Executable *pEVar1;
  int iVar2;
  offset_t oVar3;
  undefined4 extraout_var;
  size_t offset;
  offset_t rva;
  size_t index_local;
  DebugDirWrapper *this_local;
  
  oVar3 = DataDirEntryWrapper::getDirEntryAddress(&this->super_DataDirEntryWrapper);
  if ((oVar3 == 0xffffffffffffffff) || (oVar3 == 0)) {
    this_local = (DebugDirWrapper *)0x0;
  }
  else {
    pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                      (pEVar1,oVar3 + index * 0x1c,2,0x1c,0);
    this_local = (DebugDirWrapper *)CONCAT44(extraout_var,iVar2);
  }
  return (IMAGE_DEBUG_DIRECTORY *)this_local;
}

Assistant:

IMAGE_DEBUG_DIRECTORY* getDebugDir(size_t index = 0)
    {
        const offset_t rva = getDirEntryAddress();
        if (rva == INVALID_ADDR || rva == 0) {
            return NULL;
        }
        const size_t offset = index * sizeof(IMAGE_DEBUG_DIRECTORY);
        return (IMAGE_DEBUG_DIRECTORY*) m_Exe->getContentAt((rva + offset), Executable::RVA, sizeof(IMAGE_DEBUG_DIRECTORY));
    }